

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::add_if_builtin
          (ActiveBuiltinHandler *this,uint32_t id,bool allow_blocks)

{
  Variant *pVVar1;
  Compiler *pCVar2;
  BuiltIn builtin;
  SPIRVariable *pSVar3;
  Meta *pMVar4;
  SPIRType *type;
  SPIRType *type_00;
  Bitset *decoration_flags;
  ulong uVar5;
  __hashtable *__h;
  uint32_t index;
  ulong uVar6;
  bool bVar7;
  __node_gen_type __node_gen;
  __hashtable *__h_1;
  BuiltIn local_4c;
  Bitset *local_48;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_40;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  uVar5 = (ulong)id;
  if ((uVar5 < (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar5].type == TypeVariable)) {
    pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar5);
  }
  else {
    pSVar3 = (SPIRVariable *)0x0;
  }
  pMVar4 = ParsedIR::find_meta(&this->compiler->ir,(ID)id);
  if (pMVar4 != (Meta *)0x0 && pSVar3 != (SPIRVariable *)0x0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar3->super_IVariant).field_0xc);
    bVar7 = type->storage != Input;
    pCVar2 = this->compiler;
    local_48 = &pCVar2->active_input_builtins + bVar7;
    if ((pMVar4->decoration).builtin == true) {
      local_4c = (pMVar4->decoration).builtin_type;
      if (local_4c < 0x40) {
        local_48->lower = local_48->lower | 1L << ((byte)local_4c & 0x3f);
      }
      else {
        local_40 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&(&pCVar2->active_input_builtins)[bVar7].higher;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_40,&local_4c);
      }
      handle_builtin(this,type,(pMVar4->decoration).builtin_type,
                     &(pMVar4->decoration).decoration_flags);
    }
    else if (((allow_blocks) &&
             (bVar7 = ParsedIR::has_decoration(&pCVar2->ir,(ID)(type->super_IVariant).self.id,Block)
             , bVar7)) &&
            (uVar5 = (ulong)(uint)(type->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size, uVar5 != 0)) {
      local_38 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_48->higher;
      uVar6 = 0;
      do {
        index = (uint32_t)uVar6;
        bVar7 = ParsedIR::has_member_decoration
                          (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,BuiltIn)
        ;
        if (bVar7) {
          type_00 = Variant::get<spirv_cross::SPIRType>
                              ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               (type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar6].id);
          builtin = ParsedIR::get_member_decoration
                              (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index,
                               BuiltIn);
          local_4c = builtin;
          if (builtin < 0x40) {
            local_48->lower = local_48->lower | 1L << ((byte)builtin & 0x3f);
          }
          else {
            local_40 = local_38;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_38,&local_4c,&local_40);
          }
          decoration_flags =
               ParsedIR::get_member_decoration_bitset
                         (&this->compiler->ir,(TypeID)(type->super_IVariant).self.id,index);
          handle_builtin(this,type_00,builtin,decoration_flags);
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::add_if_builtin(uint32_t id, bool allow_blocks)
{
	// Only handle plain variables here.
	// Builtins which are part of a block are handled in AccessChain.
	// If allow_blocks is used however, this is to handle initializers of blocks,
	// which implies that all members are written to.

	auto *var = compiler.maybe_get<SPIRVariable>(id);
	auto *m = compiler.ir.find_meta(id);
	if (var && m)
	{
		auto &type = compiler.get<SPIRType>(var->basetype);
		auto &decorations = m->decoration;
		auto &flags = type.storage == StorageClassInput ?
		              compiler.active_input_builtins : compiler.active_output_builtins;
		if (decorations.builtin)
		{
			flags.set(decorations.builtin_type);
			handle_builtin(type, decorations.builtin_type, decorations.decoration_flags);
		}
		else if (allow_blocks && compiler.has_decoration(type.self, DecorationBlock))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (compiler.has_member_decoration(type.self, i, DecorationBuiltIn))
				{
					auto &member_type = compiler.get<SPIRType>(type.member_types[i]);
					BuiltIn builtin = BuiltIn(compiler.get_member_decoration(type.self, i, DecorationBuiltIn));
					flags.set(builtin);
					handle_builtin(member_type, builtin, compiler.get_member_decoration_bitset(type.self, i));
				}
			}
		}
	}
}